

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uchar * jpgd::decompress_jpeg_image_from_stream
                  (jpeg_decoder_stream *pStream,int *width,int *height,int *actual_comps,
                  int req_comps)

{
  undefined1 uVar1;
  jpgd_status jVar2;
  int iVar3;
  int local_3608;
  int x_3;
  int b;
  int g;
  int r;
  int x_2;
  int YB;
  int YG;
  int YR;
  uint8 luma_1;
  int x_1;
  uint8 luma;
  undefined1 *puStack_35d8;
  int x;
  uint8 *pDst;
  void *pvStack_35c8;
  uint scan_line_len;
  uint8 *pScan_line;
  jpeg_decoder_stream *pjStack_35b8;
  int y;
  uint8 *pImage_data;
  int local_35a8;
  int dst_bpl;
  int image_height;
  int image_width;
  undefined1 local_3590 [8];
  jpeg_decoder decoder;
  int req_comps_local;
  int *actual_comps_local;
  int *height_local;
  int *width_local;
  jpeg_decoder_stream *pStream_local;
  
  if (actual_comps == (int *)0x0) {
    pStream_local = (jpeg_decoder_stream *)0x0;
  }
  else {
    *actual_comps = 0;
    if ((((pStream == (jpeg_decoder_stream *)0x0) || (width == (int *)0x0)) ||
        (height == (int *)0x0)) || (req_comps == 0)) {
      pStream_local = (jpeg_decoder_stream *)0x0;
    }
    else if (((req_comps == 1) || (req_comps == 3)) || (req_comps == 4)) {
      decoder._13652_4_ = req_comps;
      jpeg_decoder::jpeg_decoder((jpeg_decoder *)local_3590,pStream);
      jVar2 = jpeg_decoder::get_error_code((jpeg_decoder *)local_3590);
      if (jVar2 == JPGD_SUCCESS) {
        dst_bpl = jpeg_decoder::get_width((jpeg_decoder *)local_3590);
        local_35a8 = jpeg_decoder::get_height((jpeg_decoder *)local_3590);
        *width = dst_bpl;
        *height = local_35a8;
        iVar3 = jpeg_decoder::get_num_components((jpeg_decoder *)local_3590);
        *actual_comps = iVar3;
        iVar3 = jpeg_decoder::begin_decoding((jpeg_decoder *)local_3590);
        if (iVar3 == 0) {
          pImage_data._4_4_ = dst_bpl * decoder._13652_4_;
          pjStack_35b8 = (jpeg_decoder_stream *)jpgd_malloc((long)(pImage_data._4_4_ * local_35a8));
          if (pjStack_35b8 == (jpeg_decoder_stream *)0x0) {
            pStream_local = (jpeg_decoder_stream *)0x0;
          }
          else {
            for (pScan_line._4_4_ = 0; pScan_line._4_4_ < local_35a8;
                pScan_line._4_4_ = pScan_line._4_4_ + 1) {
              iVar3 = jpeg_decoder::decode
                                ((jpeg_decoder *)local_3590,&stack0xffffffffffffca38,
                                 (uint *)((long)&pDst + 4));
              if (iVar3 != 0) {
                jpgd_free(pjStack_35b8);
                pStream_local = (jpeg_decoder_stream *)0x0;
                goto LAB_001104e4;
              }
              puStack_35d8 = (undefined1 *)
                             ((long)&pjStack_35b8->_vptr_jpeg_decoder_stream +
                             (long)(pScan_line._4_4_ * pImage_data._4_4_));
              if (((decoder._13652_4_ == 1) &&
                  (iVar3 = jpeg_decoder::get_num_components((jpeg_decoder *)local_3590), iVar3 == 1)
                  ) || ((decoder._13652_4_ == 4 &&
                        (iVar3 = jpeg_decoder::get_num_components((jpeg_decoder *)local_3590),
                        iVar3 == 3)))) {
                memcpy(puStack_35d8,pvStack_35c8,(long)pImage_data._4_4_);
              }
              else {
                iVar3 = jpeg_decoder::get_num_components((jpeg_decoder *)local_3590);
                if (iVar3 == 1) {
                  if (decoder._13652_4_ == 3) {
                    for (x_1 = 0; x_1 < dst_bpl; x_1 = x_1 + 1) {
                      uVar1 = *(undefined1 *)((long)pvStack_35c8 + (long)x_1);
                      *puStack_35d8 = uVar1;
                      puStack_35d8[1] = uVar1;
                      puStack_35d8[2] = uVar1;
                      puStack_35d8 = puStack_35d8 + 3;
                    }
                  }
                  else {
                    for (YR = 0; YR < dst_bpl; YR = YR + 1) {
                      uVar1 = *(undefined1 *)((long)pvStack_35c8 + (long)YR);
                      *puStack_35d8 = uVar1;
                      puStack_35d8[1] = uVar1;
                      puStack_35d8[2] = uVar1;
                      puStack_35d8[3] = 0xff;
                      puStack_35d8 = puStack_35d8 + 4;
                    }
                  }
                }
                else {
                  iVar3 = jpeg_decoder::get_num_components((jpeg_decoder *)local_3590);
                  if (iVar3 == 3) {
                    if (decoder._13652_4_ == 1) {
                      for (g = 0; g < dst_bpl; g = g + 1) {
                        *puStack_35d8 =
                             (char)((uint)*(byte *)((long)pvStack_35c8 + (long)(g << 2)) * 0x4c8b +
                                    (uint)*(byte *)((long)pvStack_35c8 + (long)(g * 4 + 1)) * 0x9646
                                    + (uint)*(byte *)((long)pvStack_35c8 + (long)(g * 4 + 2)) *
                                      0x1d2f + 0x8000 >> 0x10);
                        puStack_35d8 = puStack_35d8 + 1;
                      }
                    }
                    else {
                      for (local_3608 = 0; local_3608 < dst_bpl; local_3608 = local_3608 + 1) {
                        *puStack_35d8 =
                             *(undefined1 *)((long)pvStack_35c8 + (long)(local_3608 << 2));
                        puStack_35d8[1] =
                             *(undefined1 *)((long)pvStack_35c8 + (long)(local_3608 * 4 + 1));
                        puStack_35d8[2] =
                             *(undefined1 *)((long)pvStack_35c8 + (long)(local_3608 * 4 + 2));
                        puStack_35d8 = puStack_35d8 + 3;
                      }
                    }
                  }
                }
              }
            }
            pStream_local = pjStack_35b8;
          }
        }
        else {
          pStream_local = (jpeg_decoder_stream *)0x0;
        }
      }
      else {
        pStream_local = (jpeg_decoder_stream *)0x0;
      }
LAB_001104e4:
      image_height = 1;
      jpeg_decoder::~jpeg_decoder((jpeg_decoder *)local_3590);
    }
    else {
      pStream_local = (jpeg_decoder_stream *)0x0;
    }
  }
  return (uchar *)pStream_local;
}

Assistant:

unsigned char *decompress_jpeg_image_from_stream(jpeg_decoder_stream *pStream, int *width, int *height, int *actual_comps, int req_comps)
{
  if (!actual_comps)
    return NULL;
  *actual_comps = 0;

  if ((!pStream) || (!width) || (!height) || (!req_comps))
    return NULL;

  if ((req_comps != 1) && (req_comps != 3) && (req_comps != 4))
    return NULL;

  jpeg_decoder decoder(pStream);
  if (decoder.get_error_code() != JPGD_SUCCESS)
    return NULL;

  const int image_width = decoder.get_width(), image_height = decoder.get_height();
  *width = image_width;
  *height = image_height;
  *actual_comps = decoder.get_num_components();

  if (decoder.begin_decoding() != JPGD_SUCCESS)
    return NULL;

  const int dst_bpl = image_width * req_comps;

  uint8 *pImage_data = (uint8*)jpgd_malloc(dst_bpl * image_height);
  if (!pImage_data)
    return NULL;

  for (int y = 0; y < image_height; y++)
  {
    const uint8* pScan_line;
    uint scan_line_len;
    if (decoder.decode((const void**)&pScan_line, &scan_line_len) != JPGD_SUCCESS)
    {
      jpgd_free(pImage_data);
      return NULL;
    }

    uint8 *pDst = pImage_data + y * dst_bpl;

    if (((req_comps == 1) && (decoder.get_num_components() == 1)) || ((req_comps == 4) && (decoder.get_num_components() == 3)))
      memcpy(pDst, pScan_line, dst_bpl);
    else if (decoder.get_num_components() == 1)
    {
      if (req_comps == 3)
      {
        for (int x = 0; x < image_width; x++)
        {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst += 3;
        }
      }
      else
      {
        for (int x = 0; x < image_width; x++)
        {
          uint8 luma = pScan_line[x];
          pDst[0] = luma;
          pDst[1] = luma;
          pDst[2] = luma;
          pDst[3] = 255;
          pDst += 4;
        }
      }
    }
    else if (decoder.get_num_components() == 3)
    {
      if (req_comps == 1)
      {
        const int YR = 19595, YG = 38470, YB = 7471;
        for (int x = 0; x < image_width; x++)
        {
          int r = pScan_line[x*4+0];
          int g = pScan_line[x*4+1];
          int b = pScan_line[x*4+2];
          *pDst++ = static_cast<uint8>((r * YR + g * YG + b * YB + 32768) >> 16);
        }
      }
      else
      {
        for (int x = 0; x < image_width; x++)
        {
          pDst[0] = pScan_line[x*4+0];
          pDst[1] = pScan_line[x*4+1];
          pDst[2] = pScan_line[x*4+2];
          pDst += 3;
        }
      }
    }
  }

  return pImage_data;
}